

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_8x8_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  byte bVar10;
  int iVar11;
  int iVar12;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  longlong *in_RDI;
  uint in_R8D;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i d [8];
  __m128i dstvec [8];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  longlong local_900;
  longlong lStack_8f8;
  longlong local_8f0;
  longlong lStack_8e8;
  longlong local_8e0;
  longlong lStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_880 [12];
  longlong local_820 [2];
  longlong local_810 [4];
  long local_7f0;
  longlong *local_7e8;
  undefined8 local_7e0;
  undefined8 local_7a0;
  __m128i *in_stack_fffffffffffff878;
  __m128i *in_stack_fffffffffffff880;
  __m128i *in_stack_fffffffffffff888;
  __m128i *in_stack_fffffffffffff890;
  __m128i *in_stack_fffffffffffff898;
  __m128i *in_stack_fffffffffffff8a0;
  undefined8 local_720;
  int local_6dc;
  int local_6d8;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6a0 [32];
  int local_638;
  uint local_634;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_60;
  undefined8 uStack_58;
  
  bVar10 = (byte)in_ECX;
  iVar11 = 0xf << (bVar10 & 0x1f);
  auVar14 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar14 = vpinsrw_avx(auVar14,0x10,2);
  auVar14 = vpinsrw_avx(auVar14,0x10,3);
  auVar14 = vpinsrw_avx(auVar14,0x10,4);
  auVar14 = vpinsrw_avx(auVar14,0x10,5);
  auVar14 = vpinsrw_avx(auVar14,0x10,6);
  auVar2 = vpinsrw_avx(auVar14,0x10,7);
  auVar14 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar14 = vpinsrw_avx(auVar14,0x10,2);
  auVar14 = vpinsrw_avx(auVar14,0x10,3);
  auVar14 = vpinsrw_avx(auVar14,0x10,4);
  auVar14 = vpinsrw_avx(auVar14,0x10,5);
  auVar14 = vpinsrw_avx(auVar14,0x10,6);
  auVar14 = vpinsrw_avx(auVar14,0x10,7);
  uStack_410 = auVar14._0_8_;
  uStack_408 = auVar14._8_8_;
  bVar1 = *(byte *)(in_RDX + iVar11);
  auVar14 = vpinsrb_avx(ZEXT116(bVar1),(uint)bVar1,1);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,2);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,3);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,4);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,5);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,6);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,7);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,8);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,9);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,10);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,0xb);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,0xc);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,0xd);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,0xe);
  auVar14 = vpinsrb_avx(auVar14,(uint)bVar1,0xf);
  local_60 = auVar14._0_8_;
  uStack_58 = auVar14._8_8_;
  auVar15 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar15 = vpinsrw_avx(auVar15,0x3f,2);
  auVar15 = vpinsrw_avx(auVar15,0x3f,3);
  auVar15 = vpinsrw_avx(auVar15,0x3f,4);
  auVar15 = vpinsrw_avx(auVar15,0x3f,5);
  auVar15 = vpinsrw_avx(auVar15,0x3f,6);
  auVar15 = vpinsrw_avx(auVar15,0x3f,7);
  auVar13 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar13 = vpinsrw_avx(auVar13,0x3f,2);
  auVar13 = vpinsrw_avx(auVar13,0x3f,3);
  auVar13 = vpinsrw_avx(auVar13,0x3f,4);
  auVar13 = vpinsrw_avx(auVar13,0x3f,5);
  auVar13 = vpinsrw_avx(auVar13,0x3f,6);
  auVar13 = vpinsrw_avx(auVar13,0x3f,7);
  auVar13 = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar13;
  auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
  uStack_3d0 = auVar15._0_8_;
  uStack_3c8 = auVar15._8_8_;
  local_638 = 0;
  local_634 = in_R8D;
  while( true ) {
    if (7 < local_638) goto LAB_005d14bb;
    iVar12 = (int)local_634 >> (6 - bVar10 & 0x1f);
    local_6d8 = iVar11 - iVar12 >> (bVar10 & 0x1f);
    if (local_6d8 < 1) break;
    if (8 < local_6d8) {
      local_6d8 = 8;
    }
    local_6c0 = *(undefined1 (*) [16])(in_RDX + iVar12);
    local_6d0 = *(undefined1 (*) [16])(in_RDX + iVar12 + 1);
    if (in_ECX == 0) {
      auVar15 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,2);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,3);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,4);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,5);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,6);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,7);
      auVar3 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,2);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,3);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,4);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,5);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,6);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,7);
      auVar16 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
      uStack_350 = auVar16._0_8_;
      uStack_348 = auVar16._8_8_;
      auVar4._16_8_ = uStack_350;
      auVar4._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar3;
      auVar4._24_8_ = uStack_348;
      auVar5._16_8_ = uStack_3d0;
      auVar5._0_16_ = auVar13;
      auVar5._24_8_ = uStack_3c8;
      auVar5 = vpand_avx2(auVar4,auVar5);
      local_6a0 = vpsrlw_avx2(auVar5,ZEXT416(1));
    }
    else {
      auVar3._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar3._0_8_ = EvenOddMaskx[0]._0_8_;
      local_6c0 = vpshufb_avx(*(undefined1 (*) [16])(in_RDX + iVar12),auVar3);
      local_6d0 = vpsrldq_avx(local_6c0,8);
      auVar15 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,2);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,3);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,4);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,5);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,6);
      auVar15 = vpinsrw_avx(auVar15,local_634 & 0xffff,7);
      auVar3 = vpinsrw_avx(ZEXT216((ushort)local_634),local_634 & 0xffff,1);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,2);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,3);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,4);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,5);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,6);
      auVar3 = vpinsrw_avx(auVar3,local_634 & 0xffff,7);
      auVar16 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
      uStack_390 = auVar16._0_8_;
      uStack_388 = auVar16._8_8_;
      auVar9._16_8_ = uStack_390;
      auVar9._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar3;
      auVar9._24_8_ = uStack_388;
      auVar5 = vpsllw_avx2(auVar9,ZEXT416(in_ECX));
      auVar8._16_8_ = uStack_3d0;
      auVar8._0_16_ = auVar13;
      auVar8._24_8_ = uStack_3c8;
      auVar5 = vpand_avx2(auVar5,auVar8);
      local_6a0 = vpsrlw_avx2(auVar5,ZEXT416(1));
    }
    auVar5 = vpmovzxbw_avx2(local_6c0);
    auVar4 = vpmovzxbw_avx2(local_6d0);
    auVar4 = vpsubw_avx2(auVar4,auVar5);
    auVar5 = vpsllw_avx2(auVar5,ZEXT416(5));
    auVar6._16_8_ = uStack_410;
    auVar6._0_16_ = auVar2;
    auVar6._24_8_ = uStack_408;
    auVar5 = vpaddw_avx2(auVar5,auVar6);
    auVar4 = vpmullw_avx2(auVar4,local_6a0);
    auVar5 = vpaddw_avx2(auVar5,auVar4);
    auVar5 = vpsrlw_avx2(auVar5,ZEXT416(5));
    auVar7._16_16_ = ZEXT416(5);
    auVar7._0_16_ = auVar5._16_16_;
    auVar5 = vpackuswb_avx2(auVar5,auVar7);
    auVar15 = vpblendvb_avx(auVar14,auVar5._0_16_,*(undefined1 (*) [16])BaseMask[local_6d8]);
    *(undefined1 (*) [16])(local_880 + (long)local_638 * 2) = auVar15;
    local_634 = in_R8D + local_634;
    local_638 = local_638 + 1;
  }
  for (local_6dc = local_638; local_6dc < 8; local_6dc = local_6dc + 1) {
    local_880[(long)local_6dc * 2] = local_60;
    local_880[(long)local_6dc * 2 + 1] = uStack_58;
  }
LAB_005d14bb:
  local_7f0 = in_RSI;
  local_7e8 = in_RDI;
  transpose8x8_sse2((__m128i *)&local_8e0,(__m128i *)&local_8f0,(__m128i *)&local_900,
                    (__m128i *)local_810,&local_820,(__m128i *)0x5d1531,in_stack_fffffffffffff878,
                    in_stack_fffffffffffff880,in_stack_fffffffffffff888,in_stack_fffffffffffff890,
                    in_stack_fffffffffffff898,in_stack_fffffffffffff8a0);
  *local_7e8 = local_900;
  auVar14._8_8_ = lStack_8f8;
  auVar14._0_8_ = local_900;
  auVar14 = vpsrldq_avx(auVar14,8);
  local_720 = auVar14._0_8_;
  *(undefined8 *)((long)local_7e8 + local_7f0) = local_720;
  *(longlong *)((long)local_7e8 + local_7f0 * 2) = local_8f0;
  auVar2._8_8_ = lStack_8e8;
  auVar2._0_8_ = local_8f0;
  auVar14 = vpsrldq_avx(auVar2,8);
  *(long *)((long)local_7e8 + local_7f0 * 3) = auVar14._0_8_;
  *(longlong *)((long)local_7e8 + local_7f0 * 4) = local_8e0;
  auVar15._8_8_ = lStack_8d8;
  auVar15._0_8_ = local_8e0;
  auVar14 = vpsrldq_avx(auVar15,8);
  local_7a0 = auVar14._0_8_;
  *(undefined8 *)((long)local_7e8 + local_7f0 * 5) = local_7a0;
  *(undefined8 *)((long)local_7e8 + local_7f0 * 6) = local_8d0;
  auVar13._8_8_ = uStack_8c8;
  auVar13._0_8_ = local_8d0;
  auVar14 = vpsrldq_avx(auVar13,8);
  local_7e0 = auVar14._0_8_;
  *(undefined8 *)((long)local_7e8 + local_7f0 * 7) = local_7e0;
  return;
}

Assistant:

static void dr_prediction_z3_8x8_avx2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *left, int upsample_left,
                                      int dy) {
  __m128i dstvec[8], d[8];

  dr_prediction_z1_HxW_internal_avx2(8, 8, dstvec, left, upsample_left, dy);
  transpose8x8_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3], &dstvec[4],
                    &dstvec[5], &dstvec[6], &dstvec[7], &d[0], &d[1], &d[2],
                    &d[3]);

  _mm_storel_epi64((__m128i *)(dst + 0 * stride), d[0]);
  _mm_storel_epi64((__m128i *)(dst + 1 * stride), _mm_srli_si128(d[0], 8));
  _mm_storel_epi64((__m128i *)(dst + 2 * stride), d[1]);
  _mm_storel_epi64((__m128i *)(dst + 3 * stride), _mm_srli_si128(d[1], 8));
  _mm_storel_epi64((__m128i *)(dst + 4 * stride), d[2]);
  _mm_storel_epi64((__m128i *)(dst + 5 * stride), _mm_srli_si128(d[2], 8));
  _mm_storel_epi64((__m128i *)(dst + 6 * stride), d[3]);
  _mm_storel_epi64((__m128i *)(dst + 7 * stride), _mm_srli_si128(d[3], 8));
}